

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_sgemm_int8.h
# Opt level: O0

void ncnn::convolution_im2col_sgemm_transform_kernel_int8_sse
               (Mat *_kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  int in_ECX;
  int in_EDX;
  long *in_RSI;
  int in_R8D;
  int in_R9D;
  char *k00_3;
  int k_3;
  char *k00_2;
  int j_1;
  int k_2;
  int p_1;
  char *g00_1;
  char *k00_1;
  int i_1;
  int k_1;
  char *k00;
  int j;
  int i;
  int k;
  int p;
  char *g00;
  int q;
  Mat kernel;
  int maxk;
  Mat *m_5;
  Mat *m_4;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  Allocator *in_stack_fffffffffffff830;
  size_t in_stack_fffffffffffff838;
  undefined8 in_stack_fffffffffffff840;
  int _c;
  int _h;
  undefined8 in_stack_fffffffffffff848;
  int _w;
  Mat *in_stack_fffffffffffff850;
  Allocator *in_stack_fffffffffffff910;
  int in_stack_fffffffffffff91c;
  int in_stack_fffffffffffff920;
  int in_stack_fffffffffffff924;
  Mat *in_stack_fffffffffffff928;
  int local_68c;
  undefined8 local_688;
  undefined8 local_680;
  undefined4 local_660;
  undefined4 local_654;
  undefined8 local_648;
  void *local_640;
  int local_634;
  int local_630;
  int local_62c;
  undefined8 local_628;
  undefined8 local_620;
  undefined8 local_618;
  undefined4 local_610;
  long local_608;
  undefined4 local_600;
  undefined4 local_5fc;
  undefined4 local_5f8;
  undefined4 local_5f4;
  undefined4 local_5f0;
  undefined8 local_5e8;
  undefined1 *local_5e0;
  undefined8 local_5d8;
  undefined8 local_5d0;
  undefined8 local_5c8;
  undefined4 local_5c0;
  long *local_5b8;
  undefined4 local_5b0;
  undefined4 local_5ac;
  undefined4 local_5a8;
  undefined4 local_5a4;
  undefined4 local_5a0;
  undefined8 local_598;
  void *local_590;
  int local_588;
  int local_584;
  undefined8 local_580;
  undefined8 local_578;
  undefined8 local_570;
  undefined4 local_568;
  long *local_560;
  undefined4 local_558;
  undefined4 local_554;
  undefined4 local_550;
  undefined4 local_54c;
  undefined4 local_548;
  undefined8 local_540;
  void *local_538;
  int local_530;
  int local_52c;
  int local_528;
  int local_524;
  undefined8 local_520;
  undefined8 local_518;
  undefined8 local_510;
  undefined4 local_508;
  long local_500;
  undefined4 local_4f8;
  undefined4 local_4f4;
  undefined4 local_4f0;
  undefined4 local_4ec;
  undefined4 local_4e8;
  undefined8 local_4e0;
  undefined1 *local_4d8;
  int local_4d0;
  void *local_4c0;
  int *local_4b8;
  long local_4b0;
  long *local_4a0;
  int local_494;
  int local_490;
  long local_480;
  int local_474;
  int local_468;
  int local_464;
  long *local_460;
  undefined8 *local_450;
  undefined8 *local_448;
  undefined8 *local_440;
  undefined8 *local_438;
  undefined8 *local_430;
  undefined1 *local_428;
  void **local_420;
  int local_400;
  undefined4 local_3fc;
  void **local_3f8;
  undefined1 *local_3e8;
  undefined8 *local_3d8;
  undefined8 *local_3c8;
  undefined8 *local_3b8;
  undefined8 *local_3a8;
  undefined8 *local_398;
  undefined1 local_38d;
  int local_38c;
  void **local_388;
  undefined1 *local_380;
  undefined1 local_35d;
  int local_35c;
  void **local_358;
  undefined8 *local_350;
  undefined1 local_32d;
  int local_32c;
  undefined8 *local_320;
  undefined1 local_2fd;
  int local_2fc;
  void **local_2f8;
  undefined8 *local_2f0;
  undefined1 local_2cd;
  int local_2cc;
  void **local_2c8;
  undefined8 *local_2c0;
  undefined1 local_29d;
  int local_29c;
  long *local_298;
  undefined8 *local_290;
  long local_200;
  undefined4 local_1f4;
  long local_1f0;
  undefined1 *local_1e8;
  undefined4 local_1dc;
  int local_1d8;
  int local_1d4;
  undefined8 *local_1d0;
  void *local_1b0;
  undefined8 *local_198;
  void *local_178;
  undefined8 *local_160;
  long local_158;
  undefined4 local_14c;
  long local_148;
  undefined1 *local_140;
  undefined4 local_134;
  int local_130;
  int local_12c;
  undefined8 *local_128;
  void *local_108;
  undefined8 *local_f0;
  void *local_d0;
  undefined1 *local_b8;
  undefined4 local_ac;
  long local_a8;
  undefined4 local_9c;
  long local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined4 local_6c;
  long local_68;
  undefined4 local_5c;
  long local_58;
  undefined8 *local_50;
  undefined8 *local_48;
  int local_3c;
  undefined1 *local_38;
  int local_2c;
  undefined8 *local_28;
  int local_1c;
  undefined8 *local_18;
  int local_c;
  undefined8 *local_8;
  
  _c = (int)((ulong)in_stack_fffffffffffff840 >> 0x20);
  local_474 = in_R8D * in_R9D;
  local_468 = in_ECX;
  local_464 = in_EDX;
  local_460 = in_RSI;
  Mat::reshape(in_stack_fffffffffffff928,in_stack_fffffffffffff924,in_stack_fffffffffffff920,
               in_stack_fffffffffffff91c,in_stack_fffffffffffff910);
  _h = (int)in_stack_fffffffffffff848;
  _w = (int)((ulong)in_stack_fffffffffffff848 >> 0x20);
  if (local_468 < 4) {
    if (local_464 < 4) {
      Mat::create(in_stack_fffffffffffff850,_w,_h,_c,in_stack_fffffffffffff838,
                  in_stack_fffffffffffff830);
    }
    else {
      Mat::create(in_stack_fffffffffffff850,_w,_h,_c,in_stack_fffffffffffff838,
                  in_stack_fffffffffffff830);
    }
  }
  else if (local_464 < 4) {
    Mat::create(in_stack_fffffffffffff850,_w,_h,_c,in_stack_fffffffffffff838,
                in_stack_fffffffffffff830);
  }
  else {
    Mat::create(in_stack_fffffffffffff850,_w,_h,_c,in_stack_fffffffffffff838,
                in_stack_fffffffffffff830);
  }
  for (local_4d0 = 0; local_4d0 + 3 < local_468; local_4d0 = local_4d0 + 4) {
    local_29c = local_4d0 / 4;
    local_290 = &local_520;
    local_298 = local_460;
    local_1d4 = *(int *)((long)local_460 + 0x2c);
    local_1d8 = (int)local_460[6];
    local_1dc = *(undefined4 *)((long)local_460 + 0x34);
    local_1e8 = (undefined1 *)(*local_460 + local_460[8] * (long)local_29c * local_460[2]);
    local_1f0 = local_460[2];
    local_1f4 = (undefined4)local_460[3];
    local_200 = local_460[4];
    local_1d0 = &local_520;
    local_58 = (long)local_1d4 * (long)local_1d8 * local_1f0;
    local_5c = 0x10;
    local_29d = 1;
    local_48 = &local_520;
    local_450 = &local_520;
    local_520 = 0;
    local_510 = 0;
    local_508 = 0;
    local_4f8 = 0;
    local_4f4 = 0;
    local_4f0 = 0;
    local_4ec = 0;
    local_4e8 = 0;
    local_4e0 = 0;
    local_518 = 0;
    local_4d8 = local_1e8;
    for (local_524 = 0; local_524 + 3 < local_464; local_524 = local_524 + 4) {
      for (local_528 = 0; local_528 < local_474; local_528 = local_528 + 1) {
        for (local_52c = 0; local_52c < 4; local_52c = local_52c + 1) {
          for (local_530 = 0; local_530 < 4; local_530 = local_530 + 1) {
            local_2cc = local_4d0 + local_52c;
            local_2c0 = &local_580;
            local_2c8 = &local_4c0;
            local_1b0 = (void *)((long)local_4c0 + local_480 * local_2cc * local_4b0);
            local_198 = &local_580;
            local_560 = local_4a0;
            local_68 = (long)local_494 * (long)local_490 * local_4b0;
            local_6c = 0x10;
            local_2cd = 1;
            local_c = local_524 + local_530;
            local_8 = &local_580;
            local_538 = (void *)((long)local_1b0 + (long)local_494 * (long)local_c * local_4b0);
            local_448 = &local_580;
            local_580 = 0;
            local_570 = 0;
            local_568 = 0;
            local_558 = 0;
            local_554 = 0;
            local_550 = 0;
            local_54c = 0;
            local_548 = 0;
            local_540 = 0;
            local_578 = 0;
            *local_4d8 = *(undefined1 *)((long)local_538 + (long)local_528);
            local_4d8 = local_4d8 + 1;
            local_3a8 = local_448;
          }
        }
      }
    }
    for (; local_524 < local_464; local_524 = local_524 + 1) {
      for (local_584 = 0; local_584 < local_474; local_584 = local_584 + 1) {
        for (local_588 = 0; local_588 < 4; local_588 = local_588 + 1) {
          local_2fc = local_4d0 + local_588;
          local_2f0 = &local_5d8;
          local_2f8 = &local_4c0;
          local_178 = (void *)((long)local_4c0 + local_480 * local_2fc * local_4b0);
          local_160 = &local_5d8;
          local_5b8 = local_4a0;
          local_78 = (long)local_494 * (long)local_490 * local_4b0;
          local_7c = 0x10;
          local_2fd = 1;
          local_18 = &local_5d8;
          local_1c = local_524;
          local_590 = (void *)((long)local_178 + (long)local_494 * (long)local_524 * local_4b0);
          local_440 = &local_5d8;
          local_5d8 = 0;
          local_5c8 = 0;
          local_5c0 = 0;
          local_5b0 = 0;
          local_5ac = 0;
          local_5a8 = 0;
          local_5a4 = 0;
          local_5a0 = 0;
          local_598 = 0;
          local_5d0 = 0;
          *local_4d8 = *(undefined1 *)((long)local_590 + (long)local_584);
          local_4d8 = local_4d8 + 1;
          local_3b8 = local_440;
        }
      }
    }
    local_398 = local_450;
    local_500 = local_200;
  }
  for (; local_4d0 < local_468; local_4d0 = local_4d0 + 1) {
    local_32c = local_4d0 / 4 + local_4d0 % 4;
    local_320 = &local_628;
    local_12c = *(int *)((long)local_460 + 0x2c);
    local_130 = (int)local_460[6];
    local_134 = *(undefined4 *)((long)local_460 + 0x34);
    local_140 = (undefined1 *)(*local_460 + local_460[8] * (long)local_32c * local_460[2]);
    local_148 = local_460[2];
    local_14c = (undefined4)local_460[3];
    local_158 = local_460[4];
    local_128 = &local_628;
    local_88 = (long)local_12c * (long)local_130 * local_148;
    local_50 = &local_628;
    local_438 = &local_628;
    local_8c = 0x10;
    local_32d = 1;
    local_628 = 0;
    local_618 = 0;
    local_610 = 0;
    local_600 = 0;
    local_5fc = 0;
    local_5f8 = 0;
    local_5f4 = 0;
    local_5f0 = 0;
    local_5e8 = 0;
    local_620 = 0;
    local_5e0 = local_140;
    for (local_62c = 0; local_62c + 3 < local_464; local_62c = local_62c + 4) {
      for (local_630 = 0; local_630 < local_474; local_630 = local_630 + 1) {
        for (local_634 = 0; local_634 < 4; local_634 = local_634 + 1) {
          local_350 = &local_688;
          local_358 = &local_4c0;
          local_108 = (void *)((long)local_4c0 + local_480 * local_4d0 * local_4b0);
          local_f0 = &local_688;
          local_98 = (long)local_494 * (long)local_490 * local_4b0;
          local_2c = local_62c + local_634;
          local_28 = &local_688;
          local_640 = (void *)((long)local_108 + (long)local_494 * (long)local_2c * local_4b0);
          local_430 = &local_688;
          local_9c = 0x10;
          local_35c = local_4d0;
          local_35d = 1;
          local_688 = 0;
          local_660 = 0;
          local_654 = 0;
          local_648 = 0;
          local_680 = 0;
          *local_5e0 = *(undefined1 *)((long)local_640 + (long)local_630);
          local_5e0 = local_5e0 + 1;
          local_3d8 = local_430;
        }
      }
    }
    for (; local_62c < local_464; local_62c = local_62c + 1) {
      for (local_68c = 0; local_68c < local_474; local_68c = local_68c + 1) {
        local_380 = &stack0xfffffffffffff920;
        local_388 = &local_4c0;
        local_38c = local_4d0;
        local_d0 = (void *)((long)local_4c0 + local_480 * local_4d0 * local_4b0);
        local_b8 = &stack0xfffffffffffff920;
        local_a8 = (long)local_494 * (long)local_490 * local_4b0;
        local_ac = 0x10;
        local_38d = 1;
        local_38 = &stack0xfffffffffffff920;
        local_3c = local_62c;
        local_428 = &stack0xfffffffffffff920;
        *local_5e0 = *(undefined1 *)
                      ((long)local_d0 +
                      (long)local_68c + (long)local_494 * (long)local_62c * local_4b0);
        local_5e0 = local_5e0 + 1;
        local_3e8 = local_428;
      }
    }
    local_3c8 = local_438;
    local_608 = local_158;
  }
  local_420 = &local_4c0;
  if (local_4b8 != (int *)0x0) {
    local_3fc = 0xffffffff;
    LOCK();
    local_400 = *local_4b8;
    *local_4b8 = *local_4b8 + -1;
    UNLOCK();
    if (local_400 == 1) {
      local_3f8 = local_420;
      if (local_4a0 == (long *)0x0) {
        if (local_4c0 != (void *)0x0) {
          free(local_4c0);
        }
      }
      else {
        (**(code **)(*local_4a0 + 0x18))(local_4a0,local_4c0);
      }
    }
  }
  return;
}

Assistant:

static void convolution_im2col_sgemm_transform_kernel_int8_sse(const Mat& _kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

#if __SSE2__
    // interleave
    // src = maxk-inch-outch
    // dst = 4a-4b-maxk-inch/4a-outch/4b
    Mat kernel = _kernel.reshape(maxk, inch, outch);
    if (outch >= 4)
    {
        if (inch >= 4)
            kernel_tm.create(16 * maxk, inch / 4 + inch % 4, outch / 4 + outch % 4, (size_t)1u);
        else
            kernel_tm.create(4 * maxk, inch, outch / 4 + outch % 4, (size_t)1u);
    }
    else
    {
        if (inch >= 4)
            kernel_tm.create(4 * maxk, inch / 4 + inch % 4, outch, (size_t)1u);
        else
            kernel_tm.create(1 * maxk, inch, outch, (size_t)1u);
    }

    int q = 0;
    for (; q + 3 < outch; q += 4)
    {
        signed char* g00 = kernel_tm.channel(q / 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    for (int j = 0; j < 4; j++)
                    {
                        const signed char* k00 = kernel.channel(q + i).row<const signed char>(p + j);

                        g00[0] = k00[k];

                        g00++;
                    }
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int i = 0; i < 4; i++)
                {
                    const signed char* k00 = kernel.channel(q + i).row<const signed char>(p);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
    }
    // TODO unroll 2
    for (; q < outch; q++)
    {
        signed char* g00 = kernel_tm.channel(q / 4 + q % 4);

        int p = 0;
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                for (int j = 0; j < 4; j++)
                {
                    const signed char* k00 = kernel.channel(q).row<const signed char>(p + j);

                    g00[0] = k00[k];

                    g00++;
                }
            }
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const signed char* k00 = kernel.channel(q).row<const signed char>(p);

                g00[0] = k00[k];

                g00++;
            }
        }
    }
#else  // __SSE2__
    kernel_tm = _kernel.reshape(maxk, inch, outch);
#endif // __SSE2__
}